

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Variation *variation)

{
  ostream *poVar1;
  char *pcVar2;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)(variation + 8));
  poVar1 = std::operator<<(os,asStack_38);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(asStack_38);
  if (*(int *)(variation + 0x60) == 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::operator<<(poVar1," INS");
    if (*(long *)(variation + 0x48) != 0) {
      poVar1 = std::operator<<(os," ");
      std::operator<<(poVar1,(string *)(variation + 0x40));
    }
  }
  else {
    if (*(int *)(variation + 0x60) == 2) {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      pcVar2 = " DEL";
    }
    else {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      pcVar2 = " NONE";
    }
    std::operator<<(poVar1,pcVar2);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Variation& variation) {
	os << variation.getChromosome() << " " << variation.getCoordinate1() << " ";
	switch (variation.getType()) {
	case Variation::INSERTION:
		os << variation.getCoordinate2() << " INS";
		if (variation.getSequence().size() > 0) {
			os << " " << variation.getSequence();
		}
		break;
	case Variation::DELETION:
		os << (variation.getCoordinate2()-1) << " DEL";
		break;
	default:
		os << variation.getCoordinate2() << " NONE";
		break;
	}
	return os;
}